

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMathExc.cpp
# Opt level: O0

void testMathExc(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"See if floating-point exceptions work:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1092f::test1();
  anon_unknown.dwarf_1092f::test2();
  anon_unknown.dwarf_1092f::test3();
  poVar1 = std::operator<<((ostream *)&std::cout," ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testMathExc ()
{
    std::cout << "See if floating-point exceptions work:" << std::endl;

    test1 ();
    test2 ();
    test3 ();

    std::cout << " ok" << std::endl;
}